

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_SimQualityTest(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint in_EAX;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Int_t *__ptr;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 uStack_38;
  
  iVar1 = p->vCis->nSize;
  if (10 < iVar1) {
    __assert_fail("Gia_ManCiNum(p) <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x659,"void Gia_SimQualityTest(Gia_Man_t *)");
  }
  uStack_38 = (ulong)in_EAX;
  uVar7 = 0;
  do {
    printf("%d : ",uVar7);
    Extra_PrintBinary(_stdout,(uint *)((long)&uStack_38 + 4),p->vCis->nSize);
    putchar(0x20);
    iVar2 = p->vCis->nSize;
    p_00 = (Vec_Int_t *)malloc(0x10);
    iVar4 = iVar2;
    if (iVar2 - 1U < 0xf) {
      iVar4 = 0x10;
    }
    p_00->nSize = 0;
    p_00->nCap = iVar4;
    if (iVar4 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)malloc((long)iVar4 << 2);
    }
    p_00->pArray = piVar3;
    if (0 < iVar2) {
      uVar6 = 0;
      do {
        Vec_IntPush(p_00,(uint)((uStack_38._4_4_ >> (uVar6 & 0x1f) & 1) != 0));
        uVar6 = uVar6 + 1;
      } while ((int)uVar6 < p->vCis->nSize);
    }
    __ptr = Gia_SimQualityOne(p,p_00,1);
    if ((long)__ptr->nSize < 1) {
      uVar7 = 0;
    }
    else {
      lVar5 = 0;
      uVar7 = 0;
      do {
        uVar7 = (ulong)(uint)((int)uVar7 + __ptr->pArray[lVar5]);
        lVar5 = lVar5 + 1;
      } while (__ptr->nSize != lVar5);
    }
    printf("%d ",uVar7);
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
    }
    free(p_00);
    putchar(10);
    uVar6 = uStack_38._4_4_ + 1;
    uVar7 = (ulong)uVar6;
    uStack_38 = CONCAT44(uVar6,(undefined4)uStack_38);
  } while ((int)uVar6 < 1 << ((byte)iVar1 & 0x1f));
  return;
}

Assistant:

void Gia_SimQualityTest( Gia_Man_t * p )
{
    Vec_Int_t * vPat, * vRes;
    int k, m, nMints = (1 << Gia_ManCiNum(p));
    assert( Gia_ManCiNum(p) <= 10 );
    for ( m = 0; m < nMints; m++ )
    {
        printf( "%d : ", m );
        Extra_PrintBinary( stdout, (unsigned*)&m, Gia_ManCiNum(p) );
        printf( " " );
        vPat = Vec_IntAlloc( Gia_ManCiNum(p) );
        for ( k = 0; k < Gia_ManCiNum(p); k++ )
            Vec_IntPush( vPat, (m >> k) & 1 );
        vRes = Gia_SimQualityOne( p, vPat, 1 );
        printf( "%d ", Vec_IntSum(vRes) );
        Vec_IntFree( vRes );
        Vec_IntFree( vPat );
        printf( "\n" );
    }
}